

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O1

void av1_set_mb_ur_variance(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  int *piVar4;
  bool bVar5;
  uint8_t *puVar6;
  uint uVar7;
  int iVar8;
  void *memblk;
  ulong uVar9;
  uint uVar10;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  size_t num;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  buf_2d buf;
  double local_140;
  int local_134;
  int local_130;
  int local_12c;
  ulong local_128;
  ulong local_120;
  void *local_118;
  ulong local_110;
  ulong local_108;
  double local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  double local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong local_c0;
  void *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  void *local_90;
  ulong local_88;
  long local_80;
  uint8_t *local_78;
  ulong local_70;
  ulong local_68;
  MACROBLOCKD *local_60;
  void *local_58;
  buf_2d local_50;
  void **ppvVar11;
  
  local_78 = (cpi->source->field_5).field_0.y_buffer;
  local_c0 = (ulong)(uint)(cpi->source->field_4).field_0.y_stride;
  BVar1 = ((cpi->common).seq_params)->sb_size;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
  uVar19 = (ulong)bVar2;
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
  local_120 = (ulong)bVar3;
  uVar15 = (int)((cpi->common).mi_params.mi_cols + (uint)bVar2 + -1) / (int)(uint)bVar2;
  uVar14 = (long)(int)((uint)bVar3 + (cpi->common).mi_params.mi_rows + -1) / (long)(int)(uint)bVar3;
  iVar13 = (int)uVar14;
  uVar14 = uVar14 & 0xffffffff;
  local_f8 = iVar13 * uVar15;
  num = (size_t)local_f8;
  memblk = aom_calloc(num,4);
  local_b8 = memblk;
  if (memblk == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[0]");
  }
  local_58 = aom_calloc(num,4);
  local_118 = local_58;
  if (local_58 == (void *)0x0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate mb_delta_q[1]");
  }
  iVar8 = 0;
  local_12c = 0;
  local_130 = 0;
  local_128 = (ulong)uVar15;
  local_c8 = uVar14;
  piVar12 = (int *)0x0;
  local_f4 = iVar13;
  if (0 < iVar13) {
    local_60 = &(cpi->td).mb.e_mbd;
    local_dc = (int)local_c0 * 4;
    local_a0 = uVar19;
    local_b0 = local_120 & 0xffffffff;
    iVar13 = (uint)bVar2 * 4;
    uVar14 = 0;
    iVar16 = 0;
    piVar12 = (int *)0x0;
    iVar8 = 0;
    local_90 = memblk;
    local_98 = uVar19;
    local_ec = iVar13;
    do {
      local_a8 = uVar14;
      local_f0 = iVar16;
      if (0 < (int)uVar15) {
        local_88 = (ulong)iVar16;
        local_80 = uVar14 * local_128;
        local_e8 = (int)uVar14 * (int)local_120;
        local_68 = (uVar14 + 1) * local_b0;
        local_108 = 0;
        local_110 = 0;
        local_134 = 0;
        do {
          local_e4 = (int)piVar12;
          dVar22 = NAN;
          local_e0 = iVar8;
          if (local_e8 < (cpi->common).mi_params.mi_rows) {
            local_70 = (long)local_134 + 2;
            local_100 = (double)CONCAT44(local_100._4_4_,(int)local_110 * (int)uVar19);
            uVar19 = (local_110 + 1) * local_a0;
            dVar22 = 0.0;
            local_140 = 0.0;
            uVar14 = local_88;
            do {
              puVar6 = local_78;
              if (local_100._0_4_ < (cpi->common).mi_params.mi_cols) {
                iVar13 = local_dc * (int)uVar14;
                uVar21 = local_108 & 0xffffffff;
                uVar18 = local_70;
                do {
                  local_50.buf = puVar6 + (long)(int)uVar21 + (long)iVar13;
                  local_50.stride = (int)local_c0;
                  local_d8 = dVar22;
                  uVar7 = av1_get_perpixel_variance_facade(cpi,local_60,&local_50,BLOCK_8X8,0);
                  dVar22 = log((double)(uVar7 + (uVar7 == 0)));
                  dVar22 = dVar22 + local_d8;
                  local_140 = local_140 + 1.0;
                  if ((long)(cpi->common).mi_params.mi_cols <= (long)uVar18) break;
                  uVar21 = (ulong)((int)uVar21 + 8);
                  uVar9 = uVar18 & 0xffffffff;
                  uVar18 = uVar18 + 2;
                } while (uVar9 < uVar19);
              }
              uVar14 = uVar14 + 2;
            } while (((long)uVar14 < (long)(cpi->common).mi_params.mi_rows) &&
                    ((uVar14 & 0xffffffff) < local_68));
            dVar22 = dVar22 / local_140;
            memblk = local_90;
            uVar19 = local_98;
            iVar13 = local_ec;
          }
          uVar14 = local_110;
          lVar17 = local_110 + local_80;
          dVar22 = exp(dVar22);
          local_100 = dVar22 * -0.004898;
          dVar23 = exp(local_100);
          local_d8 = dVar23 * -98.0 + 131.728;
          dVar23 = exp(local_100);
          *(int *)((long)memblk + lVar17 * 4) =
               (int)((double)(~-(ulong)(local_d8 < 0.0) & 0x3fe0000000000000 |
                             -(ulong)(local_d8 < 0.0) & 0xbfe0000000000000) +
                    dVar23 * -98.0 + 131.728);
          dVar23 = exp(dVar22 * -0.003093);
          uVar18 = -(ulong)(dVar23 * -68.8 + 180.4 < 0.0);
          local_d8 = (double)(~uVar18 & 0x3fe0000000000000 | uVar18 & 0xbfe0000000000000);
          uStack_d0 = 0;
          dVar22 = exp(dVar22 * -0.003093);
          iVar8 = (int)(dVar22 * -68.8 + 180.4 + local_d8);
          *(int *)((long)local_118 + lVar17 * 4) = iVar8;
          piVar12 = (int *)(ulong)(uint)(local_e4 + *(int *)((long)memblk + lVar17 * 4));
          iVar8 = local_e0 + iVar8;
          local_134 = local_134 + (int)uVar19;
          local_108 = (ulong)(uint)((int)local_108 + iVar13);
          local_110 = uVar14 + 1;
        } while (uVar14 + 1 != local_128);
      }
      uVar14 = local_a8 + 1;
      iVar16 = local_f0 + (int)local_120;
    } while (uVar14 != local_c8);
  }
  auVar25._0_8_ = (double)local_f8;
  auVar24._0_8_ = (double)iVar8;
  auVar24._8_8_ = (double)(int)piVar12;
  auVar25._8_8_ = auVar25._0_8_;
  auVar24 = divpd(auVar24,auVar25);
  auVar26._8_8_ = -(ulong)(auVar24._8_8_ < 0.0);
  auVar26._0_8_ = -(ulong)(auVar24._0_8_ < 0.0);
  uVar7 = movmskpd((int)uVar14,auVar26);
  dVar22 = -0.5;
  dVar23 = -0.5;
  if ((uVar7 & 2) == 0) {
    dVar23 = 0.5;
  }
  local_12c = (int)(auVar24._8_8_ + dVar23);
  if ((uVar7 & 1) == 0) {
    dVar22 = 0.5;
  }
  local_130 = (int)(auVar24._0_8_ + dVar22);
  uVar7 = (cpi->oxcf).rc_cfg.cq_level;
  uVar10 = uVar7 - local_12c;
  ppvVar11 = (void **)(ulong)uVar10;
  if ((int)uVar7 < local_12c) {
    ppvVar11 = &local_b8;
    piVar12 = &local_12c;
    bVar5 = false;
    uVar10 = uVar7;
    iVar13 = local_12c;
  }
  else if ((int)uVar7 < local_130) {
    iVar13 = local_130 - local_12c;
    bVar5 = true;
  }
  else {
    uVar10 = 0xff - uVar7;
    iVar13 = 0xff - local_130;
    ppvVar11 = &local_58;
    piVar12 = &local_130;
    bVar5 = false;
  }
  if (0 < local_f4) {
    dVar22 = (double)(int)uVar10 / (double)iVar13;
    lVar17 = 0;
    uVar14 = 0;
    do {
      if (0 < (int)uVar15) {
        piVar4 = cpi->mb_delta_q;
        uVar19 = local_128;
        lVar20 = lVar17;
        do {
          if (bVar5) {
            dVar27 = ((double)(*(int *)((long)local_118 + lVar20) - *(int *)((long)memblk + lVar20))
                      * dVar22 + (double)*(int *)((long)memblk + lVar20)) -
                     ((double)(local_130 - local_12c) * dVar22 + (double)local_12c);
            dVar23 = (double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0;
          }
          else {
            dVar27 = ((double)(cpi->oxcf).q_cfg.deltaq_strength / 100.0) * dVar22;
            dVar23 = (double)(*(int *)((long)*ppvVar11 + lVar20) - *piVar12);
          }
          *(int *)((long)piVar4 + lVar20) =
               (int)(dVar23 * dVar27 +
                    *(double *)(&DAT_004d32c0 + (ulong)(dVar23 * dVar27 < 0.0) * 8));
          lVar20 = lVar20 + 4;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + local_128 * 4;
    } while (uVar14 != local_c8);
  }
  aom_free(memblk);
  aom_free(local_118);
  return;
}

Assistant:

void av1_set_mb_ur_variance(AV1_COMP *cpi) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = cpi->common.seq_params->sb_size;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;

  int *mb_delta_q[2];
  CHECK_MEM_ERROR(cm, mb_delta_q[0],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[0])));
  CHECK_MEM_ERROR(cm, mb_delta_q[1],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[1])));

  // Approximates the model change between current version (Spet 2021) and the
  // baseline (July 2021).
  const double model_change[] = { 3.0, 3.0 };
  // The following parameters are fitted from user labeled data.
  const double a[] = { -24.50 * 4.0, -17.20 * 4.0 };
  const double b[] = { 0.004898, 0.003093 };
  const double c[] = { (29.932 + model_change[0]) * 4.0,
                       (42.100 + model_change[1]) * 4.0 };
  int delta_q_avg[2] = { 0, 0 };
  // Loop through each SB block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          unsigned int block_variance;
          block_variance = av1_get_perpixel_variance_facade(
              cpi, xd, &buf, BLOCK_8X8, AOM_PLANE_Y);

          block_variance = AOMMAX(block_variance, 1);
          var += log((double)block_variance);
          num_of_var += 1.0;
        }
      }
      var = exp(var / num_of_var);
      mb_delta_q[0][index] = RINT(a[0] * exp(-b[0] * var) + c[0]);
      mb_delta_q[1][index] = RINT(a[1] * exp(-b[1] * var) + c[1]);
      delta_q_avg[0] += mb_delta_q[0][index];
      delta_q_avg[1] += mb_delta_q[1][index];
    }
  }

  delta_q_avg[0] = RINT((double)delta_q_avg[0] / (num_rows * num_cols));
  delta_q_avg[1] = RINT((double)delta_q_avg[1] / (num_rows * num_cols));

  int model_idx;
  double scaling_factor;
  const int cq_level = cpi->oxcf.rc_cfg.cq_level;
  if (cq_level < delta_q_avg[0]) {
    model_idx = 0;
    scaling_factor = (double)cq_level / delta_q_avg[0];
  } else if (cq_level < delta_q_avg[1]) {
    model_idx = 2;
    scaling_factor =
        (double)(cq_level - delta_q_avg[0]) / (delta_q_avg[1] - delta_q_avg[0]);
  } else {
    model_idx = 1;
    scaling_factor = (double)(MAXQ - cq_level) / (MAXQ - delta_q_avg[1]);
  }

  const double new_delta_q_avg =
      delta_q_avg[0] + scaling_factor * (delta_q_avg[1] - delta_q_avg[0]);
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      if (model_idx == 2) {
        const double delta_q =
            mb_delta_q[0][index] +
            scaling_factor * (mb_delta_q[1][index] - mb_delta_q[0][index]);
        cpi->mb_delta_q[index] = RINT((double)cpi->oxcf.q_cfg.deltaq_strength /
                                      100.0 * (delta_q - new_delta_q_avg));
      } else {
        cpi->mb_delta_q[index] = RINT(
            (double)cpi->oxcf.q_cfg.deltaq_strength / 100.0 * scaling_factor *
            (mb_delta_q[model_idx][index] - delta_q_avg[model_idx]));
      }
    }
  }

  aom_free(mb_delta_q[0]);
  aom_free(mb_delta_q[1]);
}